

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

ptr<snapshot> __thiscall nuraft::raft_server::get_last_snapshot(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ptr<snapshot> pVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x5d8));
  if (iVar2 == 0) {
    this->_vptr_raft_server = *(_func_int ***)(in_RSI + 0x5c8);
    peVar1 = *(element_type **)(in_RSI + 0x5d0);
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    if (peVar1 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(peVar1->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                 super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(peVar1->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(peVar1->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                 super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(peVar1->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x5d8));
    pVar3.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    pVar3.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (ptr<snapshot>)pVar3.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ptr<snapshot> raft_server::get_last_snapshot() const {
    std::lock_guard<std::mutex> l(last_snapshot_lock_);
    ptr<snapshot> ret = last_snapshot_;
    return ret;
}